

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimetypeparser.cpp
# Opt level: O2

void __thiscall
CreateMagicMatchRuleResult::CreateMagicMatchRuleResult
          (CreateMagicMatchRuleResult *this,QStringView type,QStringView value,QStringView offsets,
          QStringView mask)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char> local_68;
  QArrayDataPointer<char16_t> local_50;
  QStringView local_38;
  QStringView local_28;
  long local_18;
  
  local_38.m_data = value.m_data;
  local_38.m_size = value.m_size;
  local_28.m_data = type.m_data;
  local_28.m_size = type.m_size;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (this->errorMessage).d.d = (Data *)0x0;
  (this->errorMessage).d.ptr = (char16_t *)0x0;
  (this->errorMessage).d.size = 0;
  QStringView::toString((QString *)&local_50,&local_28);
  QStringView::toUtf8((QByteArray *)&local_68,&local_38);
  QStringView::toString((QString *)&local_80,&offsets);
  QStringView::toLatin1((QByteArray *)&QStack_98,&mask);
  QMimeMagicRule::QMimeMagicRule
            (&this->rule,(QString *)&local_50,(QByteArray *)&local_68,(QString *)&local_80,
             (QByteArray *)&QStack_98,&this->errorMessage);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CreateMagicMatchRuleResult(QStringView type, QStringView value, QStringView offsets, QStringView mask)
        : errorMessage(), rule(type.toString(), value.toUtf8(), offsets.toString(), mask.toLatin1(), &errorMessage)
    {

    }